

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbuilder_pbx.cpp
# Opt level: O0

ProStringList * __thiscall
ProjectBuilderMakefileGenerator::fixListForOutput
          (ProjectBuilderMakefileGenerator *this,ProStringList *l)

{
  long lVar1;
  ProString *this_00;
  qsizetype qVar2;
  QList<ProString> *in_RDX;
  ProString *in_RDI;
  long in_FS_OFFSET;
  int i;
  ProStringList *ret;
  ProString *this_01;
  int local_88;
  QString *in_stack_ffffffffffffffb8;
  ProjectBuilderMakefileGenerator *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ((DataPointer *)&((DataPointer *)&in_RDI->m_string)->d)->d = (Data *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_string)->ptr = (ProString *)0xaaaaaaaaaaaaaaaa;
  ((DataPointer *)&in_RDI->m_string)->size = -0x5555555555555556;
  this_01 = in_RDI;
  ProStringList::ProStringList((ProStringList *)0x13d0ec);
  local_88 = 0;
  while( true ) {
    this_00 = (ProString *)(long)local_88;
    qVar2 = QList<ProString>::size(in_RDX);
    if (qVar2 <= (long)this_00) break;
    QList<ProString>::operator[]((QList<ProString> *)this_01,(qsizetype)this_00);
    ProString::toQString(this_00);
    fixForOutput(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    ProString::ProString(this_01,&this_00->m_string);
    QList<ProString>::operator+=((QList<ProString> *)this_01,this_00);
    ProString::~ProString((ProString *)0x13d16b);
    QString::~QString((QString *)0x13d175);
    QString::~QString((QString *)0x13d17f);
    local_88 = local_88 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (ProStringList *)in_RDI;
}

Assistant:

ProStringList
ProjectBuilderMakefileGenerator::fixListForOutput(const ProStringList &l)
{
    ProStringList ret;
    for(int i = 0; i < l.size(); i++)
        ret += fixForOutput(l[i].toQString());
    return ret;
}